

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonevector.cpp
# Opt level: O3

Error __thiscall
asmjit::v1_14::ZoneVectorBase::_resize
          (ZoneVectorBase *this,ZoneAllocator *allocator,uint32_t sizeOfT,uint32_t n)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  sbyte sVar3;
  Error EVar4;
  ZoneVectorBase *pZVar5;
  ZoneVectorBase *extraout_RAX;
  ZoneVectorBase *pZVar6;
  sbyte sVar7;
  ulong uVar8;
  uint extraout_EDX;
  long *extraout_RDX;
  void *pvVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  ZoneVectorBase *pZVar14;
  ZoneVectorBase *pZVar15;
  ulong uVar16;
  ulong in_R8;
  long lVar17;
  ZoneVectorBase *pZVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  uint uStack_d4;
  ulong uStack_d0;
  ZoneVectorBase *pZStack_c8;
  ZoneVectorBase *pZStack_c0;
  ulong uStack_b8;
  long *plStack_b0;
  ZoneVectorBase *pZStack_a8;
  ulong uStack_a0;
  ZoneVectorBase *pZStack_98;
  ZoneVectorBase *pZStack_90;
  ulong uStack_88;
  ZoneVectorBase *pZStack_78;
  ZoneVectorBase *pZStack_70;
  long *plStack_68;
  ulong uStack_60;
  ulong uStack_58;
  
  uVar11 = this->_size;
  if (n <= this->_capacity) {
LAB_0012b16b:
    if (uVar11 < n) {
      memset((void *)((ulong)uVar11 * (ulong)sizeOfT + (long)this->_data),0,
             (ulong)(n - uVar11) * (ulong)sizeOfT);
    }
    this->_size = n;
    return 0;
  }
  pZVar15 = this;
  EVar4 = _grow(this,allocator,sizeOfT,n - uVar11);
  uVar8 = (ulong)EVar4;
  if (EVar4 != 0) {
    return 1;
  }
  if (n <= this->_capacity) goto LAB_0012b16b;
  _resize();
  uVar11 = *(uint *)(extraout_RDX + 1);
  pZVar18 = (ZoneVectorBase *)(ulong)uVar11;
  if (uVar11 == 0) {
    pZVar15->_size = 0;
    return 0;
  }
  pZVar6 = (ZoneVectorBase *)pZVar15->_data;
  uVar13 = uVar11 + 0x3f;
  uVar12 = (ulong)uVar13;
  plStack_68 = extraout_RDX;
  pZVar5 = pZVar6;
  if (uVar11 <= pZVar15->_capacity) goto LAB_0012b262;
  uVar10 = uVar13 & 0xffffffc0;
  if (uVar10 < uVar11) {
    return 1;
  }
  uStack_58 = (ulong)n;
  if (((ZoneVectorBase *)allocator)->_data == (void *)0x0) {
    uStack_88 = 0x12b2d5;
    allocator = (ZoneAllocator *)pZVar15;
    ZoneBitVector::copyFrom();
    pZVar5 = extraout_RAX;
LAB_0012b2d5:
    uVar16 = (ulong)uVar10;
  }
  else {
    uStack_88 = 0x12b22e;
    pZStack_70 = (ZoneVectorBase *)allocator;
    pZVar5 = (ZoneVectorBase *)ZoneAllocator::_alloc(allocator,(ulong)(uVar10 >> 3),&uStack_60);
    if (pZVar5 == (ZoneVectorBase *)0x0) {
      return 1;
    }
    uVar16 = uStack_60 * 8;
    uVar8 = uStack_60;
    if (uVar16 < uStack_60) goto LAB_0012b2d5;
  }
  uVar10 = (uint)uVar8;
  if (pZVar6 == (ZoneVectorBase *)0x0) {
LAB_0012b258:
    pZVar15->_data = pZVar5;
    pZVar15->_capacity = (size_type)uVar16;
LAB_0012b262:
    pZVar15->_size = uVar11;
    if (0x3f < uVar13) {
      lVar17 = *plStack_68;
      uVar8 = 0;
      do {
        (&pZVar5->_data)[uVar8] = *(void **)(lVar17 + uVar8 * 8);
        uVar8 = uVar8 + 1;
      } while (uVar13 >> 6 != uVar8);
    }
    return 0;
  }
  pZVar14 = pZStack_70;
  if (pZStack_70->_data == (void *)0x0) {
    uStack_88 = 0x12b2e2;
    ZoneBitVector::copyFrom();
  }
  else {
    allocator = (ZoneAllocator *)(ulong)pZVar15->_capacity;
    pZStack_78 = pZVar5;
    if (7 < pZVar15->_capacity) {
      uStack_88 = 0x12b2c9;
      ZoneBitVector::copyFrom();
      pZVar5 = pZStack_78;
      goto LAB_0012b258;
    }
  }
  uStack_88 = 0x12b2e7;
  ZoneBitVector::copyFrom();
  plStack_b0 = plStack_68;
  pZStack_a8 = pZVar18;
  uStack_a0 = uVar16;
  pZStack_98 = pZVar6;
  pZStack_90 = pZVar15;
  uStack_88 = uVar12;
  if (uVar10 < extraout_EDX) {
    ZoneBitVector::_resize();
    pZVar5 = pZVar14;
    allocator = (ZoneAllocator *)pZVar18;
LAB_0012b58c:
    uVar11 = (uint)plStack_68;
    ZoneBitVector::_resize();
LAB_0012b591:
    uVar12 = (ulong)uVar13;
LAB_0012b38e:
    if (0x3f < uVar11 + 0x3f) {
      uVar8 = 0;
      do {
        (&pZVar6->_data)[uVar8] = (&pZVar15->_data)[uVar8];
        uVar8 = uVar8 + 1;
      } while (uVar11 + 0x3f >> 6 != uVar8);
LAB_0012b3c7:
      if (pZStack_c8->_data == (void *)0x0) {
        ZoneBitVector::_resize();
      }
      else {
        uVar13 = ((ZoneVectorBase *)allocator)->_capacity;
        if (7 < uVar13) {
          uVar8 = (ulong)(uVar13 >> 3);
          if (uVar13 < 0x1008) {
            if (uVar13 < 0x408) {
              uVar8 = uVar8 + 0x1fffffffff >> 5;
            }
            else {
              uVar8 = (uVar8 + 0x3fffffff7f >> 6) + 4;
            }
            pZVar15->_data = *(void **)(&pZStack_c8->_size + (uVar8 & 0xffffffff) * 2);
            *(ZoneVectorBase **)(&pZStack_c8->_size + (uVar8 & 0xffffffff) * 2) = pZVar15;
          }
          else {
            ZoneAllocator::_releaseDynamic((ZoneAllocator *)pZStack_c8,pZVar15,uVar8);
          }
          goto LAB_0012b438;
        }
      }
      ZoneBitVector::_resize();
      goto LAB_0012b5a3;
    }
    if (pZVar15 != (ZoneVectorBase *)0x0) goto LAB_0012b3c7;
LAB_0012b438:
    ((ZoneVectorBase *)allocator)->_data = pZVar6;
    ((ZoneVectorBase *)allocator)->_capacity = (size_type)uVar12;
    in_R8 = (ulong)uStack_d4;
    pZVar5 = pZStack_c0;
    uVar8 = uStack_d0;
    pZVar15 = pZVar6;
  }
  else {
    uVar8 = (ulong)extraout_EDX;
    pZStack_c0 = (ZoneVectorBase *)&((ZoneVectorBase *)allocator)->_size;
    uVar11 = ((ZoneVectorBase *)allocator)->_size;
    plStack_68 = (long *)(ulong)uVar11;
    if (extraout_EDX <= uVar11) {
      ZoneBitVector::_resize();
      return 0;
    }
    pZVar15 = (ZoneVectorBase *)((ZoneVectorBase *)allocator)->_data;
    pZVar5 = pZStack_c0;
    if (((ZoneVectorBase *)allocator)->_capacity < extraout_EDX) {
      uStack_d4 = (uint)in_R8;
      uVar13 = uVar10 + 0x3f & 0xffffffc0;
      if (uVar13 < extraout_EDX) {
        return 1;
      }
      if (pZVar14->_data == (void *)0x0) goto LAB_0012b58c;
      pZVar5 = (ZoneVectorBase *)(ulong)(uVar13 >> 3);
      pZVar6 = (ZoneVectorBase *)
               ZoneAllocator::_alloc((ZoneAllocator *)pZVar14,(size_t)pZVar5,&uStack_b8);
      if (pZVar6 == (ZoneVectorBase *)0x0) {
        return 1;
      }
      uVar12 = uStack_b8 * 8;
      uStack_d0 = uVar8;
      pZStack_c8 = pZVar14;
      if (uVar12 < uStack_b8) goto LAB_0012b591;
      goto LAB_0012b38e;
    }
  }
  uVar13 = uVar11 >> 6;
  pZStack_c8 = (ZoneVectorBase *)(ulong)uVar13;
  uVar10 = (uint)uVar8;
  sVar3 = (sbyte)(uVar10 & 0x3f);
  pvVar9 = (void *)-(in_R8 & 0xff);
  uVar11 = uVar11 & 0x3f;
  if (uVar11 != 0) {
    sVar7 = 0;
    if ((uVar13 == ((uint)(uVar8 >> 6) & 0x3ffffff)) && (sVar7 = sVar3, (uVar10 & 0x3f) <= uVar11))
    {
LAB_0012b5a3:
      uVar13 = (uint)pZVar5;
      ZoneBitVector::_resize();
      uVar11 = 0xcb;
      if (uVar13 < 0xcb) {
        uVar11 = uVar13;
      }
      EVar4 = String::_opString((String *)pZStack_c8,kAppend,
                                "None" + arm::FormatterInternal::formatFeature::sFeatureIndex
                                         [uVar11],0xffffffffffffffff);
      return EVar4;
    }
    (&pZVar15->_data)[(long)pZStack_c8] =
         (void *)((ulong)(&pZVar15->_data)[(long)pZStack_c8] |
                 (long)pvVar9 << (sVar7 - (char)uVar11 & 0x3fU));
    uVar13 = uVar13 + 1;
  }
  auVar2 = _DAT_0014dc40;
  auVar1 = _DAT_0014dc30;
  uVar11 = uVar10 + 0x3f >> 6;
  if (uVar13 < uVar11) {
    uVar16 = (ulong)uVar13;
    lVar17 = (uVar11 - uVar16) + -1;
    auVar19._8_4_ = (int)lVar17;
    auVar19._0_8_ = lVar17;
    auVar19._12_4_ = (int)((ulong)lVar17 >> 0x20);
    uVar12 = 0;
    auVar19 = auVar19 ^ _DAT_0014dc40;
    do {
      auVar20._8_4_ = (int)uVar12;
      auVar20._0_8_ = uVar12;
      auVar20._12_4_ = (int)(uVar12 >> 0x20);
      auVar20 = (auVar20 | auVar1) ^ auVar2;
      if ((bool)(~(auVar20._4_4_ == auVar19._4_4_ && auVar19._0_4_ < auVar20._0_4_ ||
                  auVar19._4_4_ < auVar20._4_4_) & 1)) {
        (&pZVar15->_data)[uVar16 + uVar12] = pvVar9;
      }
      if ((auVar20._12_4_ != auVar19._12_4_ || auVar20._8_4_ <= auVar19._8_4_) &&
          auVar20._12_4_ <= auVar19._12_4_) {
        *(void **)(&pZVar15->_size + uVar16 * 2 + uVar12 * 2) = pvVar9;
      }
      uVar12 = uVar12 + 2;
    } while (((uVar11 - uVar16) + 1 & 0xfffffffffffffffe) != uVar12);
  }
  if ((uVar8 & 0x3f) != 0) {
    pvVar9 = (void *)0x0;
    if ((char)in_R8 != '\0') {
      pvVar9 = (void *)~(-1L << sVar3);
    }
    (&pZVar15->_data)[uVar11 - 1] = pvVar9;
  }
  *(uint *)&pZVar5->_data = uVar10;
  return 0;
}

Assistant:

Error ZoneVectorBase::_resize(ZoneAllocator* allocator, uint32_t sizeOfT, uint32_t n) noexcept {
  uint32_t size = _size;

  if (_capacity < n) {
    ASMJIT_PROPAGATE(_grow(allocator, sizeOfT, n - size));
    ASMJIT_ASSERT(_capacity >= n);
  }

  if (size < n)
    memset(static_cast<uint8_t*>(_data) + size_t(size) * sizeOfT, 0, size_t(n - size) * sizeOfT);

  _size = n;
  return kErrorOk;
}